

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

NamespaceDeclaration * __thiscall
QXmlStreamWriterPrivate::addExtraNamespace
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView prefix)

{
  QAnyStringView s;
  QAnyStringView s_00;
  bool bVar1;
  bool bVar2;
  ushort *puVar3;
  NamespaceDeclaration *pNVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_50;
  size_t local_48;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_40;
  size_t local_38;
  long local_30;
  
  local_48 = prefix.m_size;
  local_50 = prefix.field_0;
  local_38 = namespaceUri.m_size;
  local_40 = namespaceUri.field_0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._0_4_ = 0x5422ad;
  local_70._4_4_ = 0;
  uStack_68 = 3;
  uStack_64 = 0x40000000;
  bVar1 = ::comparesEqual((QAnyStringView *)&local_50,(QAnyStringView *)&local_70);
  local_70._0_4_ = 0x51976d;
  local_70._4_4_ = 0;
  uStack_68 = 0x24;
  uStack_64 = 0x40000000;
  bVar2 = ::comparesEqual((QAnyStringView *)&local_40,(QAnyStringView *)&local_70);
  if (bVar1 && !bVar2) {
    local_70._0_4_ = 2;
    uStack_5c = 0;
    local_70._4_4_ = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_58 = "default";
    QMessageLogger::warning
              ((QMessageLogger *)&local_70,
               "Reserved prefix \'xml\' must not be bound to a different namespace name than \'http://www.w3.org/XML/1998/namespace\'"
              );
  }
  else if (!bVar1 && bVar2) {
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QAnyStringView::toString((QString *)&local_88,(QAnyStringView *)&local_50);
    local_70._0_4_ = 2;
    uStack_5c = 0;
    local_70._4_4_ = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_58 = "default";
    puVar3 = QString::utf16((QString *)&local_88);
    QMessageLogger::warning
              ((QMessageLogger *)&local_70,
               "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/XML/1998/namespace\' which \'xml\' is already bound to"
               ,puVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  local_70._0_4_ = 0x51974f;
  local_70._4_4_ = 0;
  uStack_68 = 0x1d;
  uStack_64 = 0x40000000;
  bVar1 = ::comparesEqual((QAnyStringView *)&local_40,(QAnyStringView *)&local_70);
  if (bVar1) {
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QAnyStringView::toString((QString *)&local_88,(QAnyStringView *)&local_50);
    local_70._0_4_ = 2;
    uStack_5c = 0;
    local_70._4_4_ = 0;
    uStack_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    local_58 = "default";
    puVar3 = QString::utf16((QString *)&local_88);
    QMessageLogger::warning
              ((QMessageLogger *)&local_70,
               "The prefix \'%ls\' must not be bound to namespace name \'http://www.w3.org/2000/xmlns/\'"
               ,puVar3);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  pNVar4 = QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration>::push
                     ((QXmlStreamSimpleStack<QXmlStreamPrivateTagStack::NamespaceDeclaration> *)this
                     );
  s.m_size = local_48;
  s.field_0.m_data = local_50.m_data;
  QXmlStreamPrivateTagStack::addToStringStorage
            ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,s);
  (pNVar4->prefix).m_size = CONCAT44(uStack_5c,uStack_60);
  (pNVar4->prefix).m_string = (QString *)CONCAT44(local_70._4_4_,local_70._0_4_);
  (pNVar4->prefix).m_pos = CONCAT44(uStack_64,uStack_68);
  s_00.m_size = local_38;
  s_00.field_0.m_data = local_40.m_data;
  QXmlStreamPrivateTagStack::addToStringStorage
            ((XmlStringRef *)&local_70,&this->super_QXmlStreamPrivateTagStack,s_00);
  (pNVar4->namespaceUri).m_size = CONCAT44(uStack_5c,uStack_60);
  *(undefined4 *)&(pNVar4->namespaceUri).m_string = local_70._0_4_;
  *(undefined4 *)((long)&(pNVar4->namespaceUri).m_string + 4) = local_70._4_4_;
  *(undefined4 *)&(pNVar4->namespaceUri).m_pos = uStack_68;
  *(undefined4 *)((long)&(pNVar4->namespaceUri).m_pos + 4) = uStack_64;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pNVar4;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::NamespaceDeclaration &
QXmlStreamWriterPrivate::addExtraNamespace(QAnyStringView namespaceUri, QAnyStringView prefix)
{
    const bool prefixIsXml = prefix == "xml"_L1;
    const bool namespaceUriIsXml = namespaceUri == "http://www.w3.org/XML/1998/namespace"_L1;
    if (prefixIsXml && !namespaceUriIsXml) {
        qWarning("Reserved prefix 'xml' must not be bound to a different namespace name "
                 "than 'http://www.w3.org/XML/1998/namespace'");
    } else if (!prefixIsXml && namespaceUriIsXml) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/XML/1998/namespace' which 'xml' is already bound to",
                 qUtf16Printable(prefixString));
    }
    if (namespaceUri == "http://www.w3.org/2000/xmlns/"_L1) {
        const QString prefixString = prefix.toString();
        qWarning("The prefix '%ls' must not be bound to namespace name "
                 "'http://www.w3.org/2000/xmlns/'",
                 qUtf16Printable(prefixString));
    }
    auto &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(prefix);
    namespaceDeclaration.namespaceUri = addToStringStorage(namespaceUri);
    return namespaceDeclaration;
}